

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O1

bool absl::lts_20250127::CUnescape
               (string_view source,Nonnull<std::string_*> dest,Nullable<std::string_*> error)

{
  byte bVar1;
  char32_t cVar2;
  int iVar3;
  undefined8 *puVar4;
  size_t sVar5;
  uint uVar6;
  byte *pbVar7;
  AlphaNum *pAVar8;
  size_type *psVar9;
  ulong uVar10;
  uint uVar11;
  char32_t cVar12;
  byte *pbVar13;
  byte *pbVar14;
  byte *pbVar15;
  byte *pbVar16;
  char *pcVar17;
  ulong uVar18;
  byte *buffer;
  byte *pbVar19;
  bool bVar20;
  undefined1 local_e0 [48];
  byte *local_b0;
  byte *local_a8;
  undefined1 local_a0 [48];
  string local_70;
  Nonnull<std::string_*> local_50;
  uint local_44;
  ulong local_40;
  byte *local_38;
  
  pbVar19 = (byte *)source._M_str;
  sVar5 = source._M_len;
  std::__cxx11::string::resize((ulong)dest,(char)source._M_len);
  local_38 = (byte *)(dest->_M_dataplus)._M_p;
  pbVar16 = pbVar19 + sVar5;
  pbVar13 = local_38;
  pbVar7 = pbVar19;
  pbVar15 = pbVar19;
  buffer = local_38;
  if (0 < (long)sVar5 && local_38 == pbVar19) {
    while (pbVar15 = pbVar7, buffer = pbVar13, *pbVar7 != 0x5c) {
      pbVar15 = pbVar7 + 1;
      buffer = pbVar13 + 1;
      if ((pbVar7 != pbVar13) || (pbVar13 = buffer, pbVar7 = pbVar15, pbVar16 <= pbVar15)) break;
    }
  }
  uVar18 = (ulong)(pbVar15 >= pbVar16);
  if (pbVar15 < pbVar16) {
    pbVar19 = pbVar19 + (sVar5 - 1);
    uVar18 = 0;
    local_b0 = pbVar19;
    local_a8 = pbVar16;
    do {
      bVar1 = *pbVar15;
      pbVar13 = pbVar15;
      if (bVar1 != 0x5c) goto LAB_0103c2a4;
      pbVar7 = pbVar15 + 1;
      if (pbVar19 < pbVar7) {
        if (error != (Nullable<std::string_*>)0x0) {
          std::__cxx11::string::_M_replace((ulong)error,0,(char *)error->_M_string_length,0x146f9d4)
          ;
        }
        goto LAB_0103c200;
      }
      bVar1 = *pbVar7;
      pAVar8 = (AlphaNum *)(ulong)bVar1;
      pbVar13 = pbVar7;
      if (bVar1 < 0x55) {
        if (bVar1 < 0x30) {
          if ((bVar1 == 0x22) || (bVar1 == 0x27)) goto LAB_0103c2a4;
          goto switchD_0103c307_caseD_6f;
        }
        if (7 < bVar1 - 0x30) {
          if (bVar1 == 0x3f) goto LAB_0103c2a4;
          goto switchD_0103c307_caseD_6f;
        }
        uVar11 = (int)(char)bVar1 - 0x30;
        if ((pbVar7 < pbVar19) && ((pbVar15[2] & 0xf8) == 0x30)) {
          uVar11 = ((uint)pbVar15[2] + uVar11 * 8) - 0x30;
          pbVar13 = pbVar15 + 2;
        }
        if ((pbVar13 < pbVar19) && (pbVar15 = pbVar13 + 1, (*pbVar15 & 0xf8) == 0x30)) {
          pbVar13 = pbVar13 + 1;
          uVar11 = ((uint)*pbVar15 + uVar11 * 8) - 0x30;
        }
        if (uVar11 < 0x100) {
          *buffer = (byte)uVar11;
          buffer = buffer + 1;
        }
        else if (error != (Nullable<std::string_*>)0x0) {
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,pbVar7,pbVar13 + 1);
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x146f9ed);
          local_e0._0_8_ = local_e0 + 0x10;
          psVar9 = puVar4 + 2;
          if ((size_type *)*puVar4 == psVar9) {
            local_e0._16_8_ = *psVar9;
            local_e0._24_8_ = puVar4[3];
          }
          else {
            local_e0._16_8_ = *psVar9;
            local_e0._0_8_ = (size_type *)*puVar4;
          }
          local_e0._8_8_ = puVar4[1];
          *puVar4 = psVar9;
          puVar4[1] = 0;
          *(undefined1 *)(puVar4 + 2) = 0;
          puVar4 = (undefined8 *)std::__cxx11::string::append(local_e0);
          pAVar8 = (AlphaNum *)(puVar4 + 2);
          if ((AlphaNum *)*puVar4 == pAVar8) {
            local_a0._16_8_ = (pAVar8->piece_)._M_len;
            local_a0._24_8_ = puVar4[3];
            local_a0._0_8_ = (AlphaNum *)(local_a0 + 0x10);
          }
          else {
            local_a0._16_8_ = (pAVar8->piece_)._M_len;
            local_a0._0_8_ = (AlphaNum *)*puVar4;
          }
          local_a0._8_8_ = puVar4[1];
          *puVar4 = pAVar8;
          puVar4[1] = 0;
          *(undefined1 *)(puVar4 + 2) = 0;
          std::__cxx11::string::operator=((string *)error,(string *)local_a0);
          if ((AlphaNum *)local_a0._0_8_ != (AlphaNum *)(local_a0 + 0x10)) {
            operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
          }
          if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
            operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
          }
          pbVar16 = local_a8;
          pbVar19 = local_b0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            pbVar16 = local_a8;
            pbVar19 = local_b0;
          }
        }
LAB_0103cbbd:
        if (0xff < uVar11) goto LAB_0103c200;
      }
      else {
        if (bVar1 < 0x62) {
          if (bVar1 < 0x5c) {
            if (bVar1 == 0x55) {
              if (pbVar15 + 9 < pbVar16) {
                uVar10 = 0;
                uVar11 = 0;
                pbVar15 = pbVar15 + 3;
                local_50 = dest;
                local_40 = uVar18;
                cVar12 = L'\0';
                do {
                  pbVar14 = pbVar15;
                  bVar1 = pbVar14[-1];
                  if (-1 < (char)(&ascii_internal::kPropertyBits)[bVar1]) {
                    pbVar13 = pbVar14 + -2;
                    pbVar19 = local_b0;
                    if (error != (Nullable<std::string_*>)0x0) {
                      local_e0._0_8_ = local_e0 + 0x10;
                      local_44 = (uint)uVar10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_e0,pbVar7,pbVar14 + -1);
                      puVar4 = (undefined8 *)
                               std::__cxx11::string::replace
                                         ((ulong)local_e0,0,(char *)0x0,0x146fa70);
                      pAVar8 = (AlphaNum *)(puVar4 + 2);
                      if ((AlphaNum *)*puVar4 == pAVar8) {
                        local_a0._16_8_ = (pAVar8->piece_)._M_len;
                        local_a0._24_8_ = puVar4[3];
                        local_a0._0_8_ = (AlphaNum *)(local_a0 + 0x10);
                      }
                      else {
                        local_a0._16_8_ = (pAVar8->piece_)._M_len;
                        local_a0._0_8_ = (AlphaNum *)*puVar4;
                      }
                      local_a0._8_8_ = puVar4[1];
                      *puVar4 = pAVar8;
                      puVar4[1] = 0;
                      *(undefined1 *)(puVar4 + 2) = 0;
                      std::__cxx11::string::operator=((string *)error,(string *)local_a0);
                      if ((AlphaNum *)local_a0._0_8_ != (AlphaNum *)(local_a0 + 0x10)) {
                        operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
                      }
                      pbVar19 = local_b0;
                      if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
                        operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
                      }
                      uVar10 = (ulong)local_44;
                      pbVar16 = local_a8;
                      uVar18 = local_40;
                    }
                    goto LAB_0103cd09;
                  }
                  if ((uint)cVar12 < 0x11000) {
                    uVar6 = bVar1 + 9;
                    if (bVar1 < 0x3a) {
                      uVar6 = (uint)bVar1;
                    }
                    pAVar8 = (AlphaNum *)(ulong)(uVar6 & 0xf);
                    cVar2 = cVar12 << 4 | uVar6 & 0xf;
                  }
                  else {
                    cVar2 = cVar12;
                    if (error != (Nullable<std::string_*>)0x0) {
                      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
                      local_44 = (uint)uVar10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_70,pbVar7,pbVar14);
                      puVar4 = (undefined8 *)
                               std::__cxx11::string::replace
                                         ((ulong)&local_70,0,(char *)0x0,0x146f9ed);
                      local_e0._0_8_ = local_e0 + 0x10;
                      psVar9 = puVar4 + 2;
                      if ((size_type *)*puVar4 == psVar9) {
                        local_e0._16_8_ = *psVar9;
                        local_e0._24_8_ = puVar4[3];
                      }
                      else {
                        local_e0._16_8_ = *psVar9;
                        local_e0._0_8_ = (size_type *)*puVar4;
                      }
                      local_e0._8_8_ = puVar4[1];
                      *puVar4 = psVar9;
                      puVar4[1] = 0;
                      *(undefined1 *)(puVar4 + 2) = 0;
                      puVar4 = (undefined8 *)std::__cxx11::string::append(local_e0);
                      pAVar8 = (AlphaNum *)(puVar4 + 2);
                      if ((AlphaNum *)*puVar4 == pAVar8) {
                        local_a0._16_8_ = (pAVar8->piece_)._M_len;
                        local_a0._24_8_ = puVar4[3];
                        local_a0._0_8_ = (AlphaNum *)(local_a0 + 0x10);
                      }
                      else {
                        local_a0._16_8_ = (pAVar8->piece_)._M_len;
                        local_a0._0_8_ = (AlphaNum *)*puVar4;
                      }
                      local_a0._8_8_ = puVar4[1];
                      *puVar4 = pAVar8;
                      puVar4[1] = 0;
                      *(undefined1 *)(puVar4 + 2) = 0;
                      std::__cxx11::string::operator=((string *)error,(string *)local_a0);
                      if ((AlphaNum *)local_a0._0_8_ != (AlphaNum *)(local_a0 + 0x10)) {
                        operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
                      }
                      if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
                        operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_70._M_dataplus._M_p != &local_70.field_2) {
                        operator_delete(local_70._M_dataplus._M_p,
                                        local_70.field_2._M_allocated_capacity + 1);
                      }
                      uVar10 = (ulong)local_44;
                      pbVar16 = local_a8;
                      uVar18 = local_40;
                    }
                  }
                  if (0x10fff < (uint)cVar12) break;
                  bVar20 = 6 < uVar11;
                  uVar11 = uVar11 + 1;
                  pAVar8 = (AlphaNum *)(ulong)uVar11;
                  uVar10 = CONCAT71((int7)(uVar10 >> 8),bVar20);
                  pbVar15 = pbVar14 + 1;
                  cVar12 = cVar2;
                } while (uVar11 != 8);
                pbVar13 = pbVar14 + -1;
                pbVar19 = local_b0;
                cVar12 = cVar2;
LAB_0103cd09:
                if ((uVar10 & 1) != 0) {
                  if ((error != (Nullable<std::string_*>)0x0) && ((cVar12 & 0xfffff800U) == 0xd800))
                  {
                    local_a0._0_8_ = &DAT_0000002c;
                    local_a0._8_8_ = "invalid surrogate character (0xD800-DFFF): \\";
                    local_e0._0_8_ = &DAT_00000009;
                    local_e0._8_8_ = pbVar7;
                    StrCat_abi_cxx11_(&local_70,(lts_20250127 *)local_a0,(AlphaNum *)local_e0,pAVar8
                                     );
                    std::__cxx11::string::operator=((string *)error,(string *)&local_70);
                    pbVar16 = local_a8;
                    pbVar19 = local_b0;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_70._M_dataplus._M_p != &local_70.field_2) {
                      operator_delete(local_70._M_dataplus._M_p,
                                      local_70.field_2._M_allocated_capacity + 1);
                      pbVar16 = local_a8;
                      pbVar19 = local_b0;
                    }
                  }
                  if ((cVar12 & 0xfffff800U) != 0xd800) {
                    sVar5 = strings_internal::EncodeUTF8Char((char *)buffer,cVar12);
                    buffer = buffer + sVar5;
                    bVar20 = true;
                    pbVar16 = local_a8;
                    pbVar19 = local_b0;
                    dest = local_50;
                    goto LAB_0103cdf3;
                  }
                }
                bVar20 = false;
                dest = local_50;
              }
              else {
                if (error != (Nullable<std::string_*>)0x0) {
                  local_e0._0_8_ = local_e0 + 0x10;
                  local_e0._8_8_ = (byte *)0x1;
                  local_e0[0x11] = 0;
                  local_e0[0x10] = *pbVar7;
                  puVar4 = (undefined8 *)
                           std::__cxx11::string::replace((ulong)local_e0,0,(char *)0x0,0x146fa70);
                  goto LAB_0103c993;
                }
                bVar20 = false;
              }
LAB_0103cdf3:
              if (bVar20) goto LAB_0103cbc8;
              goto LAB_0103c200;
            }
            if (bVar1 == 0x58) goto switchD_0103c307_caseD_78;
          }
          else if ((bVar1 == 0x5c) || (bVar20 = bVar1 == 0x61, bVar1 = 7, bVar20))
          goto LAB_0103c2a4;
switchD_0103c307_caseD_6f:
          if (error != (Nullable<std::string_*>)0x0) {
            buffer = local_e0 + 0x10;
            local_e0._0_8_ = buffer;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_e0,"Unknown escape sequence: \\","");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_e0,*pbVar7);
            std::__cxx11::string::operator=((string *)error,(string *)local_a0);
            if ((AlphaNum *)local_a0._0_8_ != (AlphaNum *)(local_a0 + 0x10)) {
              operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
            }
            if ((byte *)local_e0._0_8_ != buffer) {
              operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
            }
          }
          goto LAB_0103c200;
        }
        switch(bVar1) {
        case 0x6e:
          bVar1 = 10;
          break;
        case 0x6f:
        case 0x70:
        case 0x71:
        case 0x73:
        case 0x77:
          goto switchD_0103c307_caseD_6f;
        case 0x72:
          bVar1 = 0xd;
          break;
        case 0x74:
          bVar1 = 9;
          break;
        case 0x75:
          pbVar13 = pbVar15 + 5;
          if (pbVar13 < pbVar16) {
            pbVar15 = pbVar15 + 2;
            iVar3 = 4;
            cVar12 = L'\0';
            do {
              cVar2 = cVar12;
              bVar1 = *pbVar15;
              if (-1 < (char)((AlphaNum *)(ulong)bVar1)[0x6cebc].piece_._M_len) {
                pbVar13 = pbVar15 + -1;
                local_50 = dest;
                if (error == (Nullable<std::string_*>)0x0) goto LAB_0103cc62;
                local_e0._0_8_ = local_e0 + 0x10;
                local_40 = uVar18;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,pbVar7,pbVar15);
                dest = local_50;
                puVar4 = (undefined8 *)
                         std::__cxx11::string::replace((ulong)local_e0,0,(char *)0x0,0x146fa49);
                pAVar8 = (AlphaNum *)(puVar4 + 2);
                if ((AlphaNum *)*puVar4 == pAVar8) {
                  local_a0._16_8_ = (pAVar8->piece_)._M_len;
                  local_a0._24_8_ = puVar4[3];
                  local_a0._0_8_ = (AlphaNum *)(local_a0 + 0x10);
                }
                else {
                  local_a0._16_8_ = (pAVar8->piece_)._M_len;
                  local_a0._0_8_ = (AlphaNum *)*puVar4;
                }
                local_a0._8_8_ = puVar4[1];
                *puVar4 = pAVar8;
                puVar4[1] = 0;
                *(undefined1 *)(puVar4 + 2) = 0;
                std::__cxx11::string::operator=((string *)error,(string *)local_a0);
                if ((AlphaNum *)local_a0._0_8_ != (AlphaNum *)(local_a0 + 0x10)) {
                  operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
                }
                uVar18 = local_40;
                pbVar7 = pbVar13;
                if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
                  operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
                  uVar18 = local_40;
                }
                goto LAB_0103ca22;
              }
              uVar11 = bVar1 + 9;
              if (bVar1 < 0x3a) {
                uVar11 = (uint)bVar1;
              }
              cVar12 = uVar11 & 0xf | cVar2 << 4;
              pbVar15 = pbVar15 + 1;
              iVar3 = iVar3 + -1;
            } while (iVar3 != 0);
            uVar11 = cVar2 & 0xfffff80;
            local_50 = dest;
            if ((error != (Nullable<std::string_*>)0x0) && (uVar11 == 0xd80)) {
              local_a0._0_8_ = &DAT_0000002c;
              local_a0._8_8_ = "invalid surrogate character (0xD800-DFFF): \\";
              local_e0._0_8_ = &DAT_00000005;
              local_e0._8_8_ = pbVar7;
              StrCat_abi_cxx11_(&local_70,(lts_20250127 *)local_a0,(AlphaNum *)local_e0,
                                (AlphaNum *)(ulong)bVar1);
              std::__cxx11::string::operator=((string *)error,(string *)&local_70);
              pbVar16 = local_a8;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) {
                operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1
                               );
                pbVar16 = local_a8;
              }
            }
            if (uVar11 == 0xd80) {
LAB_0103cc62:
              bVar20 = false;
              pbVar19 = local_b0;
              dest = local_50;
            }
            else {
              sVar5 = strings_internal::EncodeUTF8Char((char *)buffer,cVar12);
              buffer = buffer + sVar5;
              bVar20 = true;
              pbVar16 = local_a8;
              pbVar19 = local_b0;
              dest = local_50;
            }
          }
          else if (error == (Nullable<std::string_*>)0x0) {
            bVar20 = false;
            pbVar13 = pbVar7;
            pbVar19 = local_b0;
          }
          else {
            local_e0._0_8_ = local_e0 + 0x10;
            local_e0._8_8_ = (byte *)0x1;
            local_e0[0x11] = 0;
            local_e0[0x10] = *pbVar7;
            puVar4 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)local_e0,0,(char *)0x0,0x146fa49);
LAB_0103c993:
            pAVar8 = (AlphaNum *)(puVar4 + 2);
            if ((AlphaNum *)*puVar4 == pAVar8) {
              local_a0._16_8_ = (pAVar8->piece_)._M_len;
              local_a0._24_8_ = puVar4[3];
              local_a0._0_8_ = (AlphaNum *)(local_a0 + 0x10);
            }
            else {
              local_a0._16_8_ = (pAVar8->piece_)._M_len;
              local_a0._0_8_ = (AlphaNum *)*puVar4;
            }
            local_a0._8_8_ = puVar4[1];
            *puVar4 = pAVar8;
            puVar4[1] = 0;
            *(undefined1 *)(puVar4 + 2) = 0;
            std::__cxx11::string::operator=((string *)error,(string *)local_a0);
            if ((AlphaNum *)local_a0._0_8_ != (AlphaNum *)(local_a0 + 0x10)) {
              operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
            }
            if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
              operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
            }
LAB_0103ca22:
            bVar20 = false;
            pbVar16 = local_a8;
            pbVar13 = pbVar7;
            pbVar19 = local_b0;
          }
          goto LAB_0103cdf3;
        case 0x76:
          bVar1 = 0xb;
          break;
        case 0x78:
switchD_0103c307_caseD_78:
          if (pbVar7 < pbVar19) {
            if ((char)(&ascii_internal::kPropertyBits)[pbVar15[2]] < '\0') {
              uVar11 = 0;
              do {
                bVar1 = pbVar13[1];
                if (-1 < (char)(&ascii_internal::kPropertyBits)[bVar1]) break;
                pbVar13 = pbVar13 + 1;
                uVar6 = bVar1 + 9;
                if (bVar1 < 0x3a) {
                  uVar6 = (uint)bVar1;
                }
                uVar11 = uVar11 << 4 | uVar6 & 0xf;
              } while (pbVar13 < pbVar19);
              if (uVar11 < 0x100) {
                *buffer = (byte)uVar11;
                buffer = buffer + 1;
              }
              else if (error != (Nullable<std::string_*>)0x0) {
                local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_70,pbVar7,pbVar13 + 1);
                puVar4 = (undefined8 *)
                         std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x146f9ed);
                local_e0._0_8_ = local_e0 + 0x10;
                psVar9 = puVar4 + 2;
                if ((size_type *)*puVar4 == psVar9) {
                  local_e0._16_8_ = *psVar9;
                  local_e0._24_8_ = puVar4[3];
                }
                else {
                  local_e0._16_8_ = *psVar9;
                  local_e0._0_8_ = (size_type *)*puVar4;
                }
                local_e0._8_8_ = puVar4[1];
                *puVar4 = psVar9;
                puVar4[1] = 0;
                *(undefined1 *)(puVar4 + 2) = 0;
                puVar4 = (undefined8 *)std::__cxx11::string::append(local_e0);
                pAVar8 = (AlphaNum *)(puVar4 + 2);
                if ((AlphaNum *)*puVar4 == pAVar8) {
                  local_a0._16_8_ = (pAVar8->piece_)._M_len;
                  local_a0._24_8_ = puVar4[3];
                  local_a0._0_8_ = (AlphaNum *)(local_a0 + 0x10);
                }
                else {
                  local_a0._16_8_ = (pAVar8->piece_)._M_len;
                  local_a0._0_8_ = (AlphaNum *)*puVar4;
                }
                local_a0._8_8_ = puVar4[1];
                *puVar4 = pAVar8;
                puVar4[1] = 0;
                *(undefined1 *)(puVar4 + 2) = 0;
                std::__cxx11::string::operator=((string *)error,(string *)local_a0);
                if ((AlphaNum *)local_a0._0_8_ != (AlphaNum *)(local_a0 + 0x10)) {
                  operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
                }
                if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
                  operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
                }
                pbVar16 = local_a8;
                pbVar19 = local_b0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_70._M_dataplus._M_p != &local_70.field_2) {
                  operator_delete(local_70._M_dataplus._M_p,
                                  local_70.field_2._M_allocated_capacity + 1);
                  pbVar16 = local_a8;
                  pbVar19 = local_b0;
                }
              }
              goto LAB_0103cbbd;
            }
            if (error == (Nullable<std::string_*>)0x0) goto LAB_0103c200;
            pcVar17 = "\\x cannot be followed by a non-hex digit";
          }
          else {
            if (error == (Nullable<std::string_*>)0x0) goto LAB_0103c200;
            pcVar17 = "String cannot end with \\x";
          }
          std::__cxx11::string::operator=((string *)error,pcVar17);
          goto LAB_0103c200;
        default:
          if (bVar1 == 0x66) {
            bVar1 = 0xc;
          }
          else {
            if (bVar1 != 0x62) goto switchD_0103c307_caseD_6f;
            bVar1 = 8;
          }
        }
LAB_0103c2a4:
        *buffer = bVar1;
        buffer = buffer + 1;
      }
LAB_0103cbc8:
      pbVar15 = pbVar13 + 1;
      uVar18 = CONCAT71((int7)(uVar18 >> 8),pbVar16 <= pbVar15);
    } while (pbVar16 > pbVar15);
  }
  buffer = buffer + -(long)local_38;
LAB_0103c200:
  if ((uVar18 & 1) != 0) {
    if ((byte *)dest->_M_string_length < buffer) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                 buffer);
    }
    dest->_M_string_length = (size_type)buffer;
    buffer[(long)(dest->_M_dataplus)._M_p] = 0;
  }
  return (bool)((byte)uVar18 & 1);
}

Assistant:

bool CUnescape(absl::string_view source, absl::Nonnull<std::string*> dest,
               absl::Nullable<std::string*> error) {
  return CUnescapeInternal(source, kUnescapeNulls, dest, error);
}